

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O3

XMLCh * __thiscall xercesc_4_0::QName::getRawName(QName *this)

{
  short *psVar1;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  int iVar4;
  undefined4 extraout_var;
  XMLCh *__src;
  ulong uVar6;
  XMLCh **ppXVar7;
  long lVar8;
  XMLCh *pXVar5;
  
  ppXVar7 = &this->fRawName;
  pXVar5 = this->fRawName;
  if ((pXVar5 != (XMLCh *)0x0) && (*pXVar5 != L'\0')) goto LAB_00235bc7;
  __src = this->fPrefix;
  if (*__src == L'\0') {
    ppXVar7 = &this->fLocalPart;
    goto LAB_00235bc7;
  }
  XVar2 = this->fPrefixBufSz;
  XVar3 = this->fLocalPartBufSz;
  uVar6 = XVar3 + XVar2 + 1;
  if ((pXVar5 == (XMLCh *)0x0) || (this->fRawNameBufSz < uVar6)) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pXVar5);
    this->fRawName = (XMLCh *)0x0;
    this->fRawNameBufSz = uVar6;
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,(XVar3 + XVar2) * 2 + 4);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var,iVar4);
    this->fRawName = pXVar5;
    *pXVar5 = L'\0';
    __src = this->fPrefix;
    if (__src != (XMLCh *)0x0) goto LAB_00235b82;
    __src = (XMLCh *)0x0;
    lVar8 = 0;
  }
  else {
LAB_00235b82:
    lVar8 = 0;
    do {
      psVar1 = (short *)((long)__src + lVar8);
      lVar8 = lVar8 + 2;
    } while (*psVar1 != 0);
    lVar8 = (lVar8 >> 1) + -1;
  }
  memmove(pXVar5,__src,lVar8 * 2);
  pXVar5 = this->fRawName;
  pXVar5[lVar8] = L':';
  XMLString::copyString(pXVar5 + lVar8 + 1,this->fLocalPart);
LAB_00235bc7:
  return *ppXVar7;
}

Assistant:

XMLCh* QName::getRawName()
{
    //
    //  If there is no buffer, or if there is but we've not faulted in the
    //  value yet, then we have to do that now.
    //
    if (!fRawName || !*fRawName)
    {
        //
        //  If we have a prefix, then do the prefix:name version. Else, its
        //  just the name.
        //
        if (*fPrefix)
        {
            //
            //  Calculate the worst case size buffer we will need. We use the
            //  current high water marks of the prefix and name buffers, so it
            //  might be a little wasteful of memory but we don't have to do
            //  string len operations on the two strings.
            //
            const XMLSize_t neededLen = fPrefixBufSz + fLocalPartBufSz + 1;

            //
            //  If no buffer, or the current one is too small, then allocate one
            //  and get rid of any old one.
            //
            if (!fRawName || (neededLen > fRawNameBufSz))
            {
                fMemoryManager->deallocate(fRawName); //delete [] fRawName;
                
                fRawName = 0;
                // We have to cast off the const'ness to do this
                (const_cast<QName*>(this))->fRawNameBufSz = neededLen;
                (const_cast<QName*>(this))->fRawName = (XMLCh*) fMemoryManager->allocate
                (
                    (neededLen + 1) * sizeof(XMLCh)
                ); //new XMLCh[neededLen + 1];

                // Make sure its initially empty
                *fRawName = 0;
            }


            const XMLSize_t prefixLen = XMLString::stringLen(fPrefix);

            XMLString::moveChars(fRawName, fPrefix, prefixLen);
            fRawName[prefixLen] = chColon;
            XMLString::copyString(&fRawName[prefixLen+1], fLocalPart);
        }
         else
        {
            return fLocalPart;
        }
    }
    return fRawName;
}